

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

pair<unsigned_long,_unsigned_long> __thiscall
google::
dense_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<ValueType,unsigned_long,18446744073709551615ul>>
::find_position<char_const*>
          (dense_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<ValueType,unsigned_long,18446744073709551615ul>>
           *this,char **key)

{
  KeyInfo *this_00;
  bool bVar1;
  char *pcVar2;
  char cVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  pair<unsigned_long,_unsigned_long> pVar8;
  char *local_58;
  ulong local_50;
  dense_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<ValueType,unsigned_long,18446744073709551615ul>>
  *local_48;
  char **local_40;
  dense_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<ValueType,unsigned_long,18446744073709551615ul>>
  *local_38;
  
  pcVar2 = *key;
  *(int *)(this + 4) = *(int *)(this + 4) + 1;
  local_50 = *(long *)(this + 0x60) - 1;
  cVar3 = *pcVar2;
  if (cVar3 == '\0') {
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    do {
      pcVar2 = pcVar2 + 1;
      uVar6 = (long)cVar3 + uVar6 * 0x21;
      cVar3 = *pcVar2;
    } while (cVar3 != '\0');
    uVar6 = uVar6 >> 3;
  }
  local_38 = this + 0x48;
  this_00 = (KeyInfo *)(this + 0x30);
  uVar6 = uVar6 & local_50;
  local_58 = *(char **)(*(long *)(this + 0x78) + uVar6 * 8);
  local_40 = key;
  bVar1 = KeyInfo::equals<char_const*,char_const*>(this_00,(char **)local_38,&local_58);
  if (bVar1) {
    uVar5 = 0xffffffffffffffff;
  }
  else {
    local_48 = this + 0x40;
    uVar5 = 0xffffffffffffffff;
    lVar7 = 1;
    do {
      if (*(long *)(this + 0x50) == 0) {
LAB_006519af:
        local_58 = *(char **)(*(long *)(this + 0x78) + uVar6 * 8);
        bVar1 = KeyInfo::equals<char_const*,char_const*>(this_00,local_40,&local_58);
        if (bVar1) {
          uVar4 = 0xffffffffffffffff;
          goto LAB_00651a18;
        }
      }
      else {
        local_58 = *(char **)(*(long *)(this + 0x78) + uVar6 * 8);
        bVar1 = KeyInfo::equals<char_const*,char_const*>(this_00,(char **)local_48,&local_58);
        if (!bVar1) goto LAB_006519af;
        if (uVar5 == 0xffffffffffffffff) {
          uVar5 = uVar6;
        }
      }
      uVar6 = uVar6 + lVar7 & local_50;
      local_58 = *(char **)(*(long *)(this + 0x78) + uVar6 * 8);
      bVar1 = KeyInfo::equals<char_const*,char_const*>(this_00,(char **)local_38,&local_58);
      lVar7 = lVar7 + 1;
    } while (!bVar1);
  }
  uVar4 = uVar6;
  if (uVar5 != 0xffffffffffffffff) {
    uVar4 = uVar5;
  }
  uVar6 = 0xffffffffffffffff;
LAB_00651a18:
  pVar8.second = uVar4;
  pVar8.first = uVar6;
  return pVar8;
}

Assistant:

std::pair<size_type, size_type> find_position(const K& key) const {
    size_type num_probes = 0;  // how many times we've probed
    const size_type bucket_count_minus_one = bucket_count() - 1;
    size_type bucknum = hash(key) & bucket_count_minus_one;
    size_type insert_pos = ILLEGAL_BUCKET;  // where we would insert
    while (1) {                             // probe until something happens
      if (test_empty(bucknum)) {            // bucket is empty
        if (insert_pos == ILLEGAL_BUCKET)   // found no prior place to insert
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, bucknum);
        else
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, insert_pos);

      } else if (test_deleted(bucknum)) {  // keep searching, but mark to insert
        if (insert_pos == ILLEGAL_BUCKET) insert_pos = bucknum;

      } else if (equals(key, get_key(table[bucknum]))) {
        return std::pair<size_type, size_type>(bucknum, ILLEGAL_BUCKET);
      }
      ++num_probes;  // we're doing another probe
      bucknum = (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one;
      assert(num_probes < bucket_count() &&
             "Hashtable is full: an error in key_equal<> or hash<>");
    }
  }